

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<QBenchmarkResult>::reallocateAndGrow
          (QArrayDataPointer<QBenchmarkResult> *this,GrowthPosition where,qsizetype n,
          QArrayDataPointer<QBenchmarkResult> *old)

{
  long lVar1;
  bool bVar2;
  QBenchmarkResult *pQVar3;
  undefined8 uVar4;
  QGenericArrayOps<QBenchmarkResult> *this_00;
  long in_RCX;
  long in_RDX;
  GrowthPosition in_ESI;
  QArrayDataPointer<QBenchmarkResult> *in_RDI;
  long in_FS_OFFSET;
  qsizetype toCopy;
  QArrayDataPointer<QBenchmarkResult> dp;
  QArrayDataPointer<QBenchmarkResult> *in_stack_ffffffffffffff68;
  AllocationOption option;
  QBenchmarkResult *in_stack_ffffffffffffff70;
  QBenchmarkResult *in_stack_ffffffffffffff78;
  QGenericArrayOps<QBenchmarkResult> *in_stack_ffffffffffffff80;
  QArrayDataPointer<QBenchmarkResult> *n_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  n_00 = in_RDI;
  if ((((in_ESI != GrowsAtEnd) || (in_RCX != 0)) ||
      (bVar2 = needsDetach((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff70), bVar2)
      ) || (in_RDX < 1)) {
    allocateGrow((QArrayDataPointer<QBenchmarkResult> *)&DAT_aaaaaaaaaaaaaaaa,(qsizetype)n_00,in_ESI
                );
    if ((0 < in_RDX) &&
       (pQVar3 = data((QArrayDataPointer<QBenchmarkResult> *)&stack0xffffffffffffffe0),
       pQVar3 == (QBenchmarkResult *)0x0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        uVar4 = qBadAlloc();
        ~QArrayDataPointer((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff70);
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
          _Unwind_Resume(uVar4);
        }
      }
      goto LAB_00122019;
    }
    if (in_RDI->size != 0) {
      bVar2 = needsDetach((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff70);
      if ((bVar2) || (in_RCX != 0)) {
        this_00 = (QGenericArrayOps<QBenchmarkResult> *)
                  operator->((QArrayDataPointer<QBenchmarkResult> *)&stack0xffffffffffffffe0);
        begin((QArrayDataPointer<QBenchmarkResult> *)0x121f27);
        begin((QArrayDataPointer<QBenchmarkResult> *)0x121f36);
        QtPrivate::QGenericArrayOps<QBenchmarkResult>::copyAppend
                  (this_00,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
      }
      else {
        in_stack_ffffffffffffff70 =
             (QBenchmarkResult *)
             operator->((QArrayDataPointer<QBenchmarkResult> *)&stack0xffffffffffffffe0);
        pQVar3 = begin((QArrayDataPointer<QBenchmarkResult> *)0x121f6c);
        begin((QArrayDataPointer<QBenchmarkResult> *)0x121f7b);
        QtPrivate::QGenericArrayOps<QBenchmarkResult>::moveAppend
                  (in_stack_ffffffffffffff80,pQVar3,in_stack_ffffffffffffff70);
      }
    }
    swap((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68)
    ;
    if (in_RCX != 0) {
      swap((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff70,
           in_stack_ffffffffffffff68);
    }
    ~QArrayDataPointer((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff70);
  }
  else {
    operator->(in_RDI);
    option = (AllocationOption)((ulong)in_stack_ffffffffffffff68 >> 0x20);
    constAllocatedCapacity((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff70);
    freeSpaceAtEnd((QArrayDataPointer<QBenchmarkResult> *)in_stack_ffffffffffffff78);
    QtPrivate::QMovableArrayOps<QBenchmarkResult>::reallocate
              ((QMovableArrayOps<QBenchmarkResult> *)in_stack_ffffffffffffff78,
               (qsizetype)in_stack_ffffffffffffff70,option);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
LAB_00122019:
  __stack_chk_fail();
}

Assistant:

Q_NEVER_INLINE void reallocateAndGrow(QArrayData::GrowthPosition where, qsizetype n,
                                          QArrayDataPointer *old = nullptr)
    {
        if constexpr (QTypeInfo<T>::isRelocatable && alignof(T) <= alignof(std::max_align_t)) {
            if (where == QArrayData::GrowsAtEnd && !old && !needsDetach() && n > 0) {
                (*this)->reallocate(constAllocatedCapacity() - freeSpaceAtEnd() + n, QArrayData::Grow); // fast path
                return;
            }
        }

        QArrayDataPointer dp(allocateGrow(*this, n, where));
        if (n > 0)
            Q_CHECK_PTR(dp.data());
        if (where == QArrayData::GrowsAtBeginning) {
            Q_ASSERT(dp.freeSpaceAtBegin() >= n);
        } else {
            Q_ASSERT(dp.freeSpaceAtEnd() >= n);
        }
        if (size) {
            qsizetype toCopy = size;
            if (n < 0)
                toCopy += n;
            if (needsDetach() || old)
                dp->copyAppend(begin(), begin() + toCopy);
            else
                dp->moveAppend(begin(), begin() + toCopy);
            Q_ASSERT(dp.size == toCopy);
        }

        swap(dp);
        if (old)
            old->swap(dp);
    }